

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O2

int Seg_ManCountIntLevels(Seg_Man_t *p,int iStartVar)

{
  Gia_Man_t *p_00;
  Vec_Int_t *pVVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  long lVar8;
  
  Vec_IntFill(p->vFirsts,p->pGia->nObjs,-1);
  Vec_IntFill(p->vNvars,p->pGia->nObjs,0);
  if (p->pLevels != (int *)0x0) {
    free(p->pLevels);
    p->pLevels = (int *)0x0;
  }
  p_00 = p->pGia;
  if (p_00->pManTime == (void *)0x0) {
    iVar3 = Gia_ManLutLevel(p_00,&p->pLevels);
    p->DelayMax = iVar3;
  }
  else {
    iVar3 = Gia_ManLutLevelWithBoxes(p_00);
    p->DelayMax = iVar3;
    pVVar1 = p->pGia->vLevels;
    piVar2 = pVVar1->pArray;
    pVVar1->nCap = 0;
    pVVar1->nSize = 0;
    pVVar1->pArray = (int *)0x0;
    p->pLevels = piVar2;
    Vec_IntFreeP(&p->pGia->vLevels);
  }
  lVar8 = 1;
  do {
    if (p->pGia->nObjs <= lVar8) {
      return iStartVar;
    }
    iVar3 = (int)lVar8;
    pGVar6 = Gia_ManObj(p->pGia,iVar3);
    if (pGVar6 == (Gia_Obj_t *)0x0) {
      return iStartVar;
    }
    uVar4 = (uint)*(ulong *)pGVar6;
    uVar7 = *(ulong *)pGVar6 & 0x1fffffff;
    if (-1 < (int)uVar4 || uVar7 == 0x1fffffff) {
      if (-1 < (int)uVar4 && (int)uVar7 != 0x1fffffff) {
        iVar5 = Gia_ObjIsLut(p->pGia,iVar3);
        if (iVar5 == 0) goto LAB_005ebac6;
        uVar4 = (uint)*(undefined8 *)pGVar6;
      }
      if (((~uVar4 & 0x9fffffff) != 0) && (iVar5 = Gia_ObjIsLut(p->pGia,iVar3), iVar5 == 0)) {
        __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsLut(p->pGia, iLut)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                      ,0x86,"int Seg_ManCountIntLevels(Seg_Man_t *, int)");
      }
      Vec_IntWriteEntry(p->vFirsts,iVar3,iStartVar);
      iVar5 = p->pLevels[lVar8];
      if (p->pLevels[lVar8] < 2) {
        iVar5 = 0;
      }
      Vec_IntWriteEntry(p->vNvars,iVar3,iVar5);
      iStartVar = iStartVar + iVar5;
    }
LAB_005ebac6:
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

int Seg_ManCountIntLevels( Seg_Man_t * p, int iStartVar )
{
    Gia_Obj_t * pObj;
    int iLut, nVars;
    Vec_IntFill( p->vFirsts, Gia_ManObjNum(p->pGia), -1 );
    Vec_IntFill( p->vNvars,  Gia_ManObjNum(p->pGia), 0 );
    ABC_FREE( p->pLevels );
    if ( p->pGia->pManTime )
    {
        p->DelayMax = Gia_ManLutLevelWithBoxes( p->pGia );
        p->pLevels = Vec_IntReleaseArray( p->pGia->vLevels );
        Vec_IntFreeP( &p->pGia->vLevels );
    }
    else
        p->DelayMax = Gia_ManLutLevel( p->pGia, &p->pLevels );
    Gia_ManForEachObj1( p->pGia, pObj, iLut )
    {
        if ( Gia_ObjIsCo(pObj) )
            continue;
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsLut(p->pGia, iLut) )
            continue;
        assert( Gia_ObjIsCi(pObj) || Gia_ObjIsLut(p->pGia, iLut) );
        Vec_IntWriteEntry( p->vFirsts, iLut, iStartVar );
        //assert( p->pLevels[iLut] > 0 );
        nVars = p->pLevels[iLut] < 2 ? 0 : p->pLevels[iLut];
        Vec_IntWriteEntry( p->vNvars,  iLut, nVars );
        iStartVar += nVars;
    }
    return iStartVar;
}